

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable_binary.hpp
# Opt level: O0

void __thiscall
cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
          (PortableBinaryOutputArchive *this,ostream *stream,Options *options)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  Options *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  PortableBinaryOutputArchive *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  *in_RDI = &PTR__PortableBinaryOutputArchive_003756b0;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U>::OutputArchive
            ((OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  *in_RDI = &PTR__PortableBinaryOutputArchive_003756b0;
  in_RDI[0x20] = in_RSI;
  bVar1 = portable_binary_detail::is_little_endian();
  bVar2 = Options::is_little_endian(in_RDX);
  *(byte *)(in_RDI + 0x21) = bVar1 ^ bVar2;
  uVar3 = Options::is_little_endian(in_RDX);
  OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            ((OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *)
             CONCAT17(uVar3,in_stack_ffffffffffffffb0),(uchar *)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

PortableBinaryOutputArchive(std::ostream & stream, Options const & options = Options::Default()) :
        OutputArchive<PortableBinaryOutputArchive, AllowEmptyClassElision>(this),
        itsStream(stream),
        itsConvertEndianness( portable_binary_detail::is_little_endian() ^ options.is_little_endian() )
      {
        this->operator()( options.is_little_endian() );
      }